

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_graphics_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *this_00;
  bool bVar1;
  VkGraphicsPipelineLibraryFlagsEXT flags;
  VkPipelineBinaryInfoKHR *pVVar2;
  WorkItem local_90;
  int local_6c;
  VkGraphicsPipelineCreateInfo *local_68;
  VkGraphicsPipelineCreateInfo *new_info;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  uint32_t i;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkPipelineBinaryInfoKHR *binaries;
  Hash custom_hash_local;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  VkPipeline pipeline_local;
  StateRecorder *this_local;
  
  pVVar2 = find_pnext<VkPipelineBinaryInfoKHR>
                     (VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR,create_info->pNext);
  if ((pVVar2 == (VkPipelineBinaryInfoKHR *)0x0) || (pVVar2->binaryCount == 0)) {
    flags = graphics_pipeline_get_effective_state_flags(create_info);
    bVar1 = graphics_pipeline_library_state_flags_have_module_state(flags);
    if (bVar1) {
      for (lock._M_device._0_4_ = 0; (uint)lock._M_device < create_info->stageCount;
          lock._M_device._0_4_ = (uint)lock._M_device + 1) {
        bVar1 = shader_stage_is_identifier_only(create_info->pStages + (uint)lock._M_device);
        if ((bVar1) && ((this->impl->should_record_identifier_only & 1U) == 0)) {
          std::lock_guard<std::mutex>::lock_guard(&lock_1,&this->impl->record_lock);
          if (pipeline != (VkPipeline)0x0) {
            Impl::push_unregister_locked<VkPipeline_T*>
                      (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
          }
          this_local._7_1_ = 1;
          std::lock_guard<std::mutex>::~lock_guard(&lock_1);
          goto LAB_001b5016;
        }
      }
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&new_info,&this->impl->record_lock);
    local_68 = (VkGraphicsPipelineCreateInfo *)0x0;
    bVar1 = Impl::copy_graphics_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&local_68);
    if (bVar1) {
      this_00 = this->impl;
      local_90.type = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
      local_90.handle = api_object_cast<unsigned_long,VkPipeline_T*>(pipeline);
      local_90.create_info = local_68;
      local_90.custom_hash = custom_hash;
      Impl::push_work_locked(this_00,&local_90);
      local_6c = 0;
    }
    else {
      if (pipeline != (VkPipeline)0x0) {
        Impl::push_unregister_locked<VkPipeline_T*>
                  (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
      }
      this_local._7_1_ = 0;
      local_6c = 1;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&new_info);
    if (local_6c == 0) {
      Impl::pump_synchronized_recording(this->impl,this);
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_001b5016:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_graphics_pipeline(VkPipeline pipeline, const VkGraphicsPipelineCreateInfo &create_info,
                                             const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                             Hash custom_hash,
                                             VkDevice device,
                                             PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// We are not allowed to look at pStages unless we're emitting pre-raster / fragment shader interface.
	// If we are using module identifier data + on use, we need to push it for record.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);
	if (graphics_pipeline_library_state_flags_have_module_state(state_flags))
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
			    !impl->should_record_identifier_only)
			{
				// Have to forget any reference if this API handle is recycled.
				std::lock_guard<std::mutex> lock(impl->record_lock);
				if (pipeline != VK_NULL_HANDLE)
					impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
				return true;
			}
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkGraphicsPipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_graphics_pipeline(&create_info, impl->temp_allocator,
		                                  base_pipelines, base_pipeline_count,
		                                  device, gsmcii,
		                                  &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}